

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_handle_zTXt(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_uint_32 pVar1;
  uint uVar2;
  int iVar3;
  png_bytep ppVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  int in_R8D;
  ulong new_size;
  png_alloc_size_t uncompressed_length;
  png_text local_60;
  
  pVar1 = png_ptr->user_chunk_cache_max;
  if (pVar1 != 0) {
    if (pVar1 == 1) {
      png_crc_finish(png_ptr,length);
      return;
    }
    png_ptr->user_chunk_cache_max = pVar1 - 1;
    if (pVar1 - 1 == 1) {
      png_crc_finish(png_ptr,length);
      pcVar7 = "no space in chunk cache";
      goto LAB_002853a9;
    }
  }
  uVar2 = png_ptr->mode;
  if ((uVar2 & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  new_size = (ulong)length;
  if ((uVar2 & 4) != 0) {
    png_ptr->mode = uVar2 | 8;
  }
  ppVar4 = png_read_buffer(png_ptr,new_size,2);
  if (ppVar4 != (png_bytep)0x0) {
    png_crc_read(png_ptr,ppVar4,length);
    iVar3 = png_crc_finish(png_ptr,0);
    if (iVar3 == 0) {
      for (uVar5 = 0;
          (uVar6 = new_size, new_size != uVar5 && (uVar6 = uVar5, ppVar4[uVar5] != '\0'));
          uVar5 = uVar5 + 1) {
      }
      if ((int)uVar6 - 0x50U < 0xffffffb1) {
        pcVar7 = "bad keyword";
      }
      else if (length < (int)uVar6 + 3U) {
        pcVar7 = "truncated";
      }
      else {
        uVar6 = uVar6 & 0xffffffff;
        if (ppVar4[uVar6 + 1] == '\0') {
          uncompressed_length = 0xffffffffffffffff;
          iVar3 = png_decompress_chunk
                            (png_ptr,length,(png_uint_32)(uVar6 + 2),&uncompressed_length,in_R8D);
          if (iVar3 == 1) {
            ppVar4 = png_ptr->read_buffer;
            if (ppVar4 == (png_bytep)0x0) {
              pcVar7 = "Read failure in png_handle_zTXt";
            }
            else {
              ppVar4[uVar6 + 2 + uncompressed_length] = '\0';
              local_60.compression = 0;
              local_60.text = (png_charp)(ppVar4 + uVar6 + 2);
              local_60.text_length = uncompressed_length;
              local_60.itxt_length = 0;
              local_60.lang = (png_charp)0x0;
              local_60.lang_key = (png_charp)0x0;
              local_60.key = (png_charp)ppVar4;
              iVar3 = png_set_text_2(png_ptr,info_ptr,&local_60,1);
              pcVar7 = (char *)0x0;
              if (iVar3 != 0) {
                pcVar7 = "insufficient memory";
              }
            }
          }
          else {
            pcVar7 = (png_ptr->zstream).msg;
          }
          if (pcVar7 == (char *)0x0) {
            return;
          }
        }
        else {
          pcVar7 = "unknown compression type";
        }
      }
      png_chunk_benign_error(png_ptr,pcVar7);
    }
    return;
  }
  png_crc_finish(png_ptr,length);
  pcVar7 = "out of memory";
LAB_002853a9:
  png_chunk_benign_error(png_ptr,pcVar7);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_zTXt(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_const_charp errmsg = NULL;
   png_bytep       buffer;
   png_uint_32     keyword_length;

   png_debug(1, "in png_handle_zTXt");

#ifdef PNG_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_cache_max != 0)
   {
      if (png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         return;
      }

      if (--png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "no space in chunk cache");
         return;
      }
   }
#endif

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
      png_ptr->mode |= PNG_AFTER_IDAT;

   /* Note, "length" is sufficient here; we won't be adding
    * a null terminator later.
    */
   buffer = png_read_buffer(png_ptr, length, 2/*silent*/);

   if (buffer == NULL)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   png_crc_read(png_ptr, buffer, length);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   /* TODO: also check that the keyword contents match the spec! */
   for (keyword_length = 0;
      keyword_length < length && buffer[keyword_length] != 0;
      ++keyword_length)
      /* Empty loop to find end of name */ ;

   if (keyword_length > 79 || keyword_length < 1)
      errmsg = "bad keyword";

   /* zTXt must have some LZ data after the keyword, although it may expand to
    * zero bytes; we need a '\0' at the end of the keyword, the compression type
    * then the LZ data:
    */
   else if (keyword_length + 3 > length)
      errmsg = "truncated";

   else if (buffer[keyword_length+1] != PNG_COMPRESSION_TYPE_BASE)
      errmsg = "unknown compression type";

   else
   {
      png_alloc_size_t uncompressed_length = PNG_SIZE_MAX;

      /* TODO: at present png_decompress_chunk imposes a single application
       * level memory limit, this should be split to different values for iCCP
       * and text chunks.
       */
      if (png_decompress_chunk(png_ptr, length, keyword_length+2,
          &uncompressed_length, 1/*terminate*/) == Z_STREAM_END)
      {
         png_text text;

         if (png_ptr->read_buffer == NULL)
           errmsg="Read failure in png_handle_zTXt";
         else
         {
            /* It worked; png_ptr->read_buffer now looks like a tEXt chunk
             * except for the extra compression type byte and the fact that
             * it isn't necessarily '\0' terminated.
             */
            buffer = png_ptr->read_buffer;
            buffer[uncompressed_length+(keyword_length+2)] = 0;

            text.compression = PNG_TEXT_COMPRESSION_zTXt;
            text.key = (png_charp)buffer;
            text.text = (png_charp)(buffer + keyword_length+2);
            text.text_length = uncompressed_length;
            text.itxt_length = 0;
            text.lang = NULL;
            text.lang_key = NULL;

            if (png_set_text_2(png_ptr, info_ptr, &text, 1) != 0)
               errmsg = "insufficient memory";
         }
      }

      else
         errmsg = png_ptr->zstream.msg;
   }

   if (errmsg != NULL)
      png_chunk_benign_error(png_ptr, errmsg);
}